

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O0

void Geometry(int ip,int iq)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  vector<Blade,_std::allocator<Blade>_> local_6a8;
  vector<Blade,_std::allocator<Blade>_> local_690;
  Clifford local_678;
  vector<Blade,_std::allocator<Blade>_> local_660;
  vector<Blade,_std::allocator<Blade>_> local_648;
  Clifford local_630;
  vector<Blade,_std::allocator<Blade>_> local_618;
  vector<Blade,_std::allocator<Blade>_> local_600;
  vector<Blade,_std::allocator<Blade>_> local_5e8;
  vector<Blade,_std::allocator<Blade>_> local_5d0;
  Clifford local_5b8;
  Clifford local_5a0;
  Clifford local_588;
  vector<Blade,_std::allocator<Blade>_> local_570;
  vector<Blade,_std::allocator<Blade>_> local_558;
  vector<Blade,_std::allocator<Blade>_> local_540;
  vector<Blade,_std::allocator<Blade>_> local_528;
  Clifford local_510;
  Clifford local_4f8;
  Clifford local_4e0;
  vector<Blade,_std::allocator<Blade>_> local_4c8;
  vector<Blade,_std::allocator<Blade>_> local_4b0;
  vector<Blade,_std::allocator<Blade>_> local_498;
  Clifford local_480;
  Clifford local_468;
  vector<Blade,_std::allocator<Blade>_> local_450;
  vector<Blade,_std::allocator<Blade>_> local_438;
  vector<Blade,_std::allocator<Blade>_> local_420;
  Clifford local_408;
  Clifford local_3f0;
  vector<Blade,_std::allocator<Blade>_> local_3d8;
  vector<Blade,_std::allocator<Blade>_> local_3c0;
  vector<Blade,_std::allocator<Blade>_> local_3a8;
  Clifford local_390;
  Clifford local_378;
  vector<Blade,_std::allocator<Blade>_> local_360;
  vector<Blade,_std::allocator<Blade>_> local_348;
  Clifford local_330;
  Clifford local_318;
  vector<Blade,_std::allocator<Blade>_> local_300;
  vector<Blade,_std::allocator<Blade>_> local_2e8;
  Clifford local_2d0;
  Clifford local_2b8;
  vector<Blade,_std::allocator<Blade>_> local_2a0;
  vector<Blade,_std::allocator<Blade>_> local_288;
  Clifford local_270;
  Clifford local_258;
  vector<Blade,_std::allocator<Blade>_> local_240;
  vector<Blade,_std::allocator<Blade>_> local_228;
  Clifford local_210;
  vector<Blade,_std::allocator<Blade>_> local_1f8;
  vector<Blade,_std::allocator<Blade>_> local_1e0;
  Clifford local_1c8;
  vector<Blade,_std::allocator<Blade>_> local_1b0;
  vector<Blade,_std::allocator<Blade>_> local_198;
  Clifford local_180;
  Blade *local_168;
  Blade local_160;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_158;
  const_iterator local_150;
  Blade *local_148;
  Blade local_140;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_138;
  const_iterator local_130;
  Blade *local_128;
  Blade local_120;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_118;
  const_iterator local_110;
  Blade *local_108;
  Blade local_100;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_f8;
  const_iterator local_f0;
  Blade *local_e8;
  Blade local_e0;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_d8;
  const_iterator local_d0;
  Blade *local_c8;
  Blade local_c0;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_b8;
  const_iterator local_b0;
  Blade *local_a8;
  Blade local_a0;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_98;
  const_iterator local_90;
  Blade *local_88;
  Blade local_80;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_78;
  const_iterator local_70;
  Blade *local_68;
  Blade local_60;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_58;
  const_iterator local_50;
  Blade *local_48;
  Blade local_30;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_28;
  const_iterator local_20;
  int local_18;
  int local_14;
  int b;
  int a;
  int iq_local;
  int ip_local;
  
  dim = 1 << ((char)ip + (char)iq & 0x1fU);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)dim;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  tp = ip;
  tq = iq;
  b = iq;
  a = ip;
  Re = (float *)operator_new__(uVar3);
  for (local_14 = 0; local_14 < dim; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < dim; local_18 = local_18 + 1) {
      iVar2 = sign2(local_14,local_18);
      signs[local_14][local_18] = iVar2;
    }
  }
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e0);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e1);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e2);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e3);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e4);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e5);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e6);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e7);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e8);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e9);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&Ie);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&Esd);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&Eds);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&eox);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&eoy);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&eoz);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&ex);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&ey);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&ez);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&eo);
  local_28._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(&e0);
  __gnu_cxx::__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>>::
  __normal_iterator<Blade*>
            ((__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>> *)&local_20,
             &local_28);
  Blade::Blade(&local_30,0);
  local_48 = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::insert(&e0,local_20,&local_30);
  Blade::~Blade(&local_30);
  local_58._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(&e1);
  __gnu_cxx::__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>>::
  __normal_iterator<Blade*>
            ((__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>> *)&local_50,
             &local_58);
  Blade::Blade(&local_60,1);
  local_68 = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::insert(&e1,local_50,&local_60);
  Blade::~Blade(&local_60);
  local_78._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(&e2);
  __gnu_cxx::__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>>::
  __normal_iterator<Blade*>
            ((__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>> *)&local_70,
             &local_78);
  Blade::Blade(&local_80,2);
  local_88 = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::insert(&e2,local_70,&local_80);
  Blade::~Blade(&local_80);
  local_98._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(&e3);
  __gnu_cxx::__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>>::
  __normal_iterator<Blade*>
            ((__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>> *)&local_90,
             &local_98);
  Blade::Blade(&local_a0,4);
  local_a8 = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::insert(&e3,local_90,&local_a0);
  Blade::~Blade(&local_a0);
  local_b8._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(&e4);
  __gnu_cxx::__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>>::
  __normal_iterator<Blade*>
            ((__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>> *)&local_b0,
             &local_b8);
  Blade::Blade(&local_c0,8);
  local_c8 = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::insert(&e4,local_b0,&local_c0);
  Blade::~Blade(&local_c0);
  local_d8._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(&e5);
  __gnu_cxx::__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>>::
  __normal_iterator<Blade*>
            ((__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>> *)&local_d0,
             &local_d8);
  Blade::Blade(&local_e0,0x10);
  local_e8 = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::insert(&e5,local_d0,&local_e0);
  Blade::~Blade(&local_e0);
  local_f8._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(&e6);
  __gnu_cxx::__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>>::
  __normal_iterator<Blade*>
            ((__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>> *)&local_f0,
             &local_f8);
  Blade::Blade(&local_100,0x20);
  local_108 = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::insert(&e6,local_f0,&local_100);
  Blade::~Blade(&local_100);
  local_118._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(&e7);
  __gnu_cxx::__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>>::
  __normal_iterator<Blade*>
            ((__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>> *)&local_110,
             &local_118);
  Blade::Blade(&local_120,0x40);
  local_128 = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::insert(&e7,local_110,&local_120);
  Blade::~Blade(&local_120);
  local_138._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(&e8);
  __gnu_cxx::__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>>::
  __normal_iterator<Blade*>
            ((__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>> *)&local_130,
             &local_138);
  Blade::Blade(&local_140,0x80);
  local_148 = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::insert(&e8,local_130,&local_140);
  Blade::~Blade(&local_140);
  local_158._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(&e9);
  __gnu_cxx::__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>>::
  __normal_iterator<Blade*>
            ((__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>> *)&local_150,
             &local_158);
  Blade::Blade(&local_160,0x100);
  local_168 = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::insert(&e9,local_150,&local_160);
  Blade::~Blade(&local_160);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_198,&e7);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_1b0,&e4);
  operator+(&local_180,&local_198,&local_1b0);
  std::vector<Blade,_std::allocator<Blade>_>::operator=(&ex,&local_180);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_180);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1b0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_198);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_1e0,&e8);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_1f8,&e5);
  operator+(&local_1c8,&local_1e0,&local_1f8);
  std::vector<Blade,_std::allocator<Blade>_>::operator=(&ey,&local_1c8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1c8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1f8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1e0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_228,&e9);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_240,&e6);
  operator+(&local_210,&local_228,&local_240);
  std::vector<Blade,_std::allocator<Blade>_>::operator=(&ez,&local_210);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_210);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_240);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_228);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_288,&e7);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_2a0,&e4);
  operator-(&local_270,&local_288,&local_2a0);
  operator*(&local_258,0.5,&local_270);
  std::vector<Blade,_std::allocator<Blade>_>::operator=(&eox,&local_258);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_258);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_270);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_2a0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_288);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_2e8,&e8);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_300,&e5);
  operator-(&local_2d0,&local_2e8,&local_300);
  operator*(&local_2b8,0.5,&local_2d0);
  std::vector<Blade,_std::allocator<Blade>_>::operator=(&eoy,&local_2b8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_2b8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_2d0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_300);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_2e8);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_348,&e9);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_360,&e6);
  operator-(&local_330,&local_348,&local_360);
  operator*(&local_318,0.5,&local_330);
  std::vector<Blade,_std::allocator<Blade>_>::operator=(&eoz,&local_318);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_318);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_330);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_360);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_348);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_3a8,&ex);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_3c0,&ey);
  operator+(&local_390,&local_3a8,&local_3c0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_3d8,&ez);
  operator+(&local_378,&local_390,&local_3d8);
  std::vector<Blade,_std::allocator<Blade>_>::operator=(&e,&local_378);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_378);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_3d8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_390);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_3c0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_3a8);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_420,&eox);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_438,&eoy);
  operator+(&local_408,&local_420,&local_438);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_450,&eoz);
  operator+(&local_3f0,&local_408,&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::operator=(&eo,&local_3f0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_3f0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_408);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_438);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_420);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_498,&e1);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_4b0,&e2);
  operator^(&local_480,&local_498,&local_4b0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_4c8,&e3);
  operator^(&local_468,&local_480,&local_4c8);
  std::vector<Blade,_std::allocator<Blade>_>::operator=(&Ie,&local_468);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_468);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_4c8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_480);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_4b0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_498);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_528,&ex);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_540,&ey);
  operator^(&local_510,&local_528,&local_540);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_558,&ez);
  operator^(&local_4f8,&local_510,&local_558);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_570,&eo);
  operator^(&local_4e0,&local_4f8,&local_570);
  std::vector<Blade,_std::allocator<Blade>_>::operator=(&Esd,&local_4e0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_4e0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_570);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_4f8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_558);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_510);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_540);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_528);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_5d0,&eox);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_5e8,&eoy);
  operator^(&local_5b8,&local_5d0,&local_5e8);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_600,&eoz);
  operator^(&local_5a0,&local_5b8,&local_600);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_618,&e);
  operator^(&local_588,&local_5a0,&local_618);
  std::vector<Blade,_std::allocator<Blade>_>::operator=(&Eds,&local_588);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_588);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_618);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_5a0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_600);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_5b8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_5e8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_5d0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_648,&Ie);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_660,&Esd);
  operator^(&local_630,&local_648,&local_660);
  std::vector<Blade,_std::allocator<Blade>_>::operator=(&Isd,&local_630);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_630);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_660);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_648);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_690,&Ie);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_6a8,&Eds);
  operator^(&local_678,&local_690,&local_6a8);
  std::vector<Blade,_std::allocator<Blade>_>::operator=(&Ids,&local_678);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_678);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_6a8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_690);
  return;
}

Assistant:

void Geometry(int ip,int iq)
{
//dimencion of algebra
	tp=ip; tq=iq;
	
	dim=(1<<(tp+tq));
	Re=new float[dim];

	for(int a=0;a<dim;a++)
	{
		for(int b=0;b<dim;b++)
		{
			signs[a][b]=sign2(a,b);	
		}
		
	}

	//init basis
	e0.clear();
	e1.clear();
	e2.clear();
	e3.clear();
	e4.clear();
	e5.clear();
	e6.clear();
	e7.clear();
	e8.clear();
	e9.clear();

	Ie.clear();
	Esd.clear();
	Eds.clear();

	eox.clear();
	eoy.clear();
	eoz.clear();
	ex.clear();
	ey.clear();
	ez.clear();
	e.clear();
	eo.clear();

	e0.insert(e0.begin(),Blade(0));
	e1.insert(e1.begin(),Blade(1));
	e2.insert(e2.begin(),Blade(2));
	e3.insert(e3.begin(),Blade(4));
	e4.insert(e4.begin(),Blade(8));
	e5.insert(e5.begin(),Blade(16));
	e6.insert(e6.begin(),Blade(32));
	e7.insert(e7.begin(),Blade(64));
	e8.insert(e8.begin(),Blade(128));
	e9.insert(e9.begin(),Blade(256));

	
	ex=e7+e4;
    ey=e8+e5;
    ez=e9+e6;
	
    eox=0.5*(e7-e4);
    eoy=0.5*(e8-e5);
    eoz=0.5*(e9-e6);
	
    e=ex+ey+ez;
    eo=eox+eoy+eoz;
  
    Ie=e1^e2^e3;
    Esd=ex^ey^ez^eo;
    Eds=eox^eoy^eoz^e;
    Isd=Ie^Esd;
    Ids=Ie^Eds;

  return ;
	
}